

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::Bloaty::ScanAndRollupFile
          (Bloaty *this,string *filename,Rollup *rollup,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_build_ids)

{
  DataSource *__args_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer ppCVar1;
  ConfiguredDataSource *pCVar2;
  RangeSink *pRVar3;
  uint64_t uVar4;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  file;
  Bloaty *pBVar5;
  Arena *pAVar6;
  DualMap *pDVar7;
  const_iterator cVar8;
  Arena *pAVar9;
  uint64_t uVar10;
  const_iterator cVar11;
  pointer __old_p;
  InputFile *pIVar12;
  pointer ppCVar13;
  _Rb_tree_header *p_Var14;
  string_view name;
  string build_id;
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  sinks;
  DualMaps maps;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> filename_sink_ptrs;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> sink_ptrs;
  NameMunger empty_munger;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  local_158;
  undefined1 local_150 [16];
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  local_140;
  Bloaty *local_138;
  Arena *local_130;
  Arena *local_128;
  key_type local_120;
  Arena *local_100;
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  local_f8;
  DualMaps local_e0;
  string *local_c8;
  _Head_base<0UL,_google::protobuf::Arena_*,_false> local_c0;
  _Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> local_b8;
  _Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> local_98;
  __pointer_type local_78;
  Block *local_70;
  undefined1 local_68 [24];
  string local_50;
  
  local_128 = (Arena *)out_build_ids;
  local_c8 = filename;
  GetObjectFile((Bloaty *)local_150,(string *)this);
  DualMaps::DualMaps(&local_e0);
  local_f8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._0_8_ =
       (((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
        (local_150._0_8_ + 8))->_M_t).
       super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
       super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
       super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  local_100 = (Arena *)&this->options_;
  local_c0._M_head_impl._0_4_ = 6;
  local_150._8_8_ = (_func_int **)0x0;
  local_140.ptr_ = (void *)0x0;
  std::
  make_unique<bloaty::RangeSink,bloaty::InputFile_const*,bloaty::Options_const&,bloaty::DataSource,decltype(nullptr),decltype(nullptr)>
            ((InputFile **)&local_120,(Options *)local_68,(DataSource *)local_100,
             &local_c0._M_head_impl,(void **)(local_150 + 8));
  std::
  vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
  ::emplace_back<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>
            ((vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
              *)&local_f8,
             (unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)&local_120);
  std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::~unique_ptr
            ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)&local_120);
  local_68._0_8_ = (_func_int **)0x0;
  local_68._8_8_ = (void *)0x0;
  local_68._16_8_ = (pointer)0x0;
  RangeSink::AddOutput
            ((RangeSink *)
             ((Rep *)((long)local_f8.
                            super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements[0],
             ((local_e0.maps_.
               super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
             super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
             super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl,(NameMunger *)local_68);
  local_120._M_dataplus._M_p =
       (pointer)((Rep *)((long)local_f8.
                               super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements[0];
  local_130 = (Arena *)rollup;
  std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
  emplace_back<bloaty::RangeSink*>
            ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_98,
             (RangeSink **)&local_120);
  ppCVar1 = (this->sources_).
            super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_138 = this;
  for (ppCVar13 = (this->sources_).
                  super__Vector_base<bloaty::ConfiguredDataSource_*,_std::allocator<bloaty::ConfiguredDataSource_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppCVar13 != ppCVar1;
      ppCVar13 = ppCVar13 + 1) {
    pCVar2 = *ppCVar13;
    local_150._8_8_ =
         (((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
          (local_150._0_8_ + 8))->_M_t).
         super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
         super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
         super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
    __args_3 = &pCVar2->effective_source;
    local_140.ptr_ =
         ((local_e0.maps_.
           super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
         super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
         super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl;
    local_c0._M_head_impl =
         (local_138->arena_)._M_t.
         super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>
         .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl;
    std::
    make_unique<bloaty::RangeSink,bloaty::InputFile_const*,bloaty::Options_const&,bloaty::DataSource&,bloaty::DualMap*,google::protobuf::Arena*>
              ((InputFile **)&local_120,(Options *)(local_150 + 8),(DataSource *)local_100,
               (DualMap **)__args_3,(Arena **)&local_140);
    std::
    vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
    ::emplace_back<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>
              ((vector<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>,std::allocator<std::unique_ptr<bloaty::RangeSink,std::default_delete<bloaty::RangeSink>>>>
                *)&local_f8,
               (unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)&local_120)
    ;
    std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>::~unique_ptr
              ((unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_> *)&local_120)
    ;
    pRVar3 = (RangeSink *)
             ((Rep *)((long)local_f8.
                            super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements[0];
    pDVar7 = DualMaps::AppendMap(&local_e0);
    RangeSink::AddOutput
              (pRVar3,pDVar7,
               (pCVar2->munger)._M_t.
               super___uniq_ptr_impl<bloaty::NameMunger,_std::default_delete<bloaty::NameMunger>_>.
               _M_t.
               super__Tuple_impl<0UL,_bloaty::NameMunger_*,_std::default_delete<bloaty::NameMunger>_>
               .super__Head_base<0UL,_bloaty::NameMunger_*,_false>._M_head_impl);
    if (*__args_3 == kInputFiles) {
      local_120._M_dataplus._M_p =
           (pointer)((Rep *)((long)local_f8.
                                   super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements[0]
      ;
      std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
      emplace_back<bloaty::RangeSink*>
                ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_b8,
                 (RangeSink **)&local_120);
    }
    else {
      local_120._M_dataplus._M_p =
           (pointer)((Rep *)((long)local_f8.
                                   super__Vector_base<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -0x10))->elements[0]
      ;
      std::vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>>::
      emplace_back<bloaty::RangeSink*>
                ((vector<bloaty::RangeSink*,std::allocator<bloaty::RangeSink*>> *)&local_98,
                 (RangeSink **)&local_120);
    }
  }
  (*(*(_func_int ***)local_150._0_8_)[2])(&local_120);
  if ((Arena *)local_120._M_string_length == (Arena *)0x0) {
    local_158.ptr_ = (InputFile *)0x0;
    pAVar9 = local_130;
  }
  else {
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(local_138->debug_files_)._M_t,&local_120);
    if ((_Rb_tree_header *)cVar8._M_node ==
        &(local_138->debug_files_)._M_t._M_impl.super__Rb_tree_header) {
      pIVar12 = (InputFile *)0x0;
    }
    else {
      GetObjectFile((Bloaty *)(local_150 + 8),(string *)local_138);
      pIVar12 = (InputFile *)local_150._8_8_;
      ObjectFile::set_debug_file((ObjectFile *)local_150._0_8_,(ObjectFile *)local_150._8_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128,&local_120);
    }
    pBVar5 = local_138;
    this_00 = &local_138->sourcemap_files_;
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_120);
    p_Var14 = &(pBVar5->sourcemap_files_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar8._M_node == p_Var14) {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,local_c8);
    }
    pAVar9 = local_130;
    local_158.ptr_ = pIVar12;
    if ((_Rb_tree_header *)cVar8._M_node != p_Var14) {
      (*local_138->file_factory_->_vptr_InputFileFactory[2])
                (local_150 + 8,local_138->file_factory_,cVar8._M_node + 2);
      std::__cxx11::string::string((string *)&local_50,(string *)&local_120);
      TryOpenSourceMapFile
                ((bloaty *)&local_140,
                 (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                 (local_150 + 8),&local_50);
      file.ptr_ = local_140.ptr_;
      local_158.ptr_ = local_140.ptr_;
      local_140.ptr_ = (void *)0x0;
      if ((pIVar12 != (InputFile *)0x0) &&
         ((*pIVar12->_vptr_InputFile[1])(pIVar12), (long *)local_140.ptr_ != (long *)0x0)) {
        (**(code **)(*local_140.ptr_ + 8))();
      }
      local_140.ptr_ = (void *)0x0;
      std::__cxx11::string::~string((string *)&local_50);
      ObjectFile::set_debug_file((ObjectFile *)local_150._0_8_,(ObjectFile *)file.ptr_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128,&local_120);
      pAVar9 = local_130;
      if ((_func_int **)local_150._8_8_ != (_func_int **)0x0) {
        (**(code **)(*(long *)local_150._8_8_ + 0x10))();
      }
    }
  }
  local_78 = (pAVar9->impl_).hint_._M_b._M_p;
  local_70 = (pAVar9->impl_).initial_block_;
  (*(*(_func_int ***)local_150._0_8_)[3])(local_150._0_8_,&local_98);
  local_128 = (Arena *)local_b8._M_impl.super__Vector_impl_data._M_finish;
  pAVar9 = (Arena *)local_b8._M_impl.super__Vector_impl_data._M_start;
  while (pAVar6 = local_130, pAVar9 != local_128) {
    pRVar3 = (RangeSink *)(pAVar9->impl_).threads_._M_b._M_p;
    pDVar7 = ((local_e0.maps_.
               super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
             super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
             super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl;
    local_100 = pAVar9;
    for (cVar11._M_node =
              *(_Base_ptr *)
               &((_Rb_tree_header *)(&(pDVar7->vm_map).mappings_._M_t._M_impl.field_0x0 + 0x18))->
                _M_header;
        (_Rb_tree_header *)cVar11._M_node !=
        (_Rb_tree_header *)(&(pDVar7->vm_map).mappings_._M_t._M_impl.field_0x0 + 8);
        cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node)) {
      uVar4 = *(uint64_t *)(cVar11._M_node + 1);
      uVar10 = RangeMap::RangeEnd(&pDVar7->vm_map,cVar11);
      RangeSink::AddVMRange
                (pRVar3,"inputfile_vmcopier",uVar4,uVar10 - *(long *)(cVar11._M_node + 1),
                 &pRVar3->file_->filename_);
    }
    pDVar7 = ((local_e0.maps_.
               super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>._M_t.
             super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>.
             super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl;
    for (cVar11._M_node =
              (pDVar7->file_map).mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)cVar11._M_node !=
        &(pDVar7->file_map).mappings_._M_t._M_impl.super__Rb_tree_header;
        cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node)) {
      uVar4 = *(uint64_t *)(cVar11._M_node + 1);
      uVar10 = RangeMap::RangeEnd(&pDVar7->file_map,cVar11);
      name._M_str = (pRVar3->file_->filename_)._M_dataplus._M_p;
      name._M_len = (pRVar3->file_->filename_)._M_string_length;
      RangeSink::AddFileRange
                (pRVar3,"inputfile_filecopier",name,uVar4,uVar10 - *(long *)(cVar11._M_node + 1));
    }
    pAVar9 = (Arena *)&(local_100->impl_).hint_;
  }
  DualMaps::ComputeRollup(&local_e0,(Rollup *)local_130);
  if (((long)(pAVar6->impl_).hint_._M_b._M_p - ((long)&local_70->next_ + (long)local_78)) +
      (long)(pAVar6->impl_).initial_block_ !=
      (((((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
         (local_150._0_8_ + 8))->_M_t).
        super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
        super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
        super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl)->data_)._M_len) {
    __assert_fail("filesize == file->file_data().data().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x71d,
                  "void bloaty::Bloaty::ScanAndRollupFile(const std::string &, Rollup *, std::vector<std::string> *) const"
                 );
  }
  if ((0 < verbose_level) || ((local_138->options_).dump_raw_map_ == true)) {
    printf("Maps for %s:\n\n",(local_c8->_M_dataplus)._M_p);
    if (show != 1) {
      puts("FILE MAP:");
      DualMaps::PrintFileMaps(&local_e0);
      if (show == 0) goto LAB_0017dbd5;
    }
    puts("VM MAP:");
    DualMaps::PrintVMMaps(&local_e0);
  }
LAB_0017dbd5:
  std::__cxx11::string::~string((string *)&local_120);
  if ((InputFile *)local_158.ptr_ != (InputFile *)0x0) {
    (*(*(_func_int ***)local_158.ptr_)[1])();
  }
  std::
  vector<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_68);
  std::_Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::~_Vector_base
            (&local_b8);
  std::_Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::~_Vector_base
            (&local_98);
  std::
  vector<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>,_std::allocator<std::unique_ptr<bloaty::RangeSink,_std::default_delete<bloaty::RangeSink>_>_>_>
  ::~vector(&local_f8);
  std::
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  ::~vector(&local_e0.maps_);
  if ((ObjectFile *)local_150._0_8_ != (ObjectFile *)0x0) {
    (*(*(_func_int ***)local_150._0_8_)[1])();
  }
  return;
}

Assistant:

void Bloaty::ScanAndRollupFile(const std::string& filename, Rollup* rollup,
                               std::vector<std::string>* out_build_ids) const {
  auto file = GetObjectFile(filename);

  DualMaps maps;
  std::vector<std::unique_ptr<RangeSink>> sinks;
  std::vector<RangeSink*> sink_ptrs;
  std::vector<RangeSink*> filename_sink_ptrs;

  // Base map always goes first.
  sinks.push_back(absl::make_unique<RangeSink>(
      &file->file_data(), options_, DataSource::kSegments, nullptr, nullptr));
  NameMunger empty_munger;
  sinks.back()->AddOutput(maps.base_map(), &empty_munger);
  sink_ptrs.push_back(sinks.back().get());

  for (auto source : sources_) {
    sinks.push_back(absl::make_unique<RangeSink>(
        &file->file_data(), options_, source->effective_source, maps.base_map(),
        arena_.get()));
    sinks.back()->AddOutput(maps.AppendMap(), source->munger.get());
    // We handle the kInputFiles data source internally, without handing it off
    // to the file format implementation.  This seems slightly simpler, since
    // the file format has to deal with armembers too.
    if (source->effective_source == DataSource::kInputFiles) {
      filename_sink_ptrs.push_back(sinks.back().get());
    } else {
      sink_ptrs.push_back(sinks.back().get());
    }
  }

  std::unique_ptr<ObjectFile> debug_file;
  std::string build_id = file->GetBuildId();
  if (!build_id.empty()) {
    auto iter = debug_files_.find(build_id);
    if (iter != debug_files_.end()) {
      debug_file = GetObjectFile(iter->second);
      file->set_debug_file(debug_file.get());
      out_build_ids->push_back(build_id);
    }

    // Maybe it's a source map file?
    auto sourcemap_iter = sourcemap_files_.find(build_id);
    // If the source map by build id isn't found, try the file name.
    if (sourcemap_iter == sourcemap_files_.end()) {
      sourcemap_iter = sourcemap_files_.find(filename);
    }
    if (sourcemap_iter != sourcemap_files_.end()) {
      std::unique_ptr<InputFile> sourcemap_file(
          file_factory_.OpenFile(sourcemap_iter->second));
      // The build id is not present in the source map file itself, so it must
      // be passed here.
      debug_file = TryOpenSourceMapFile(sourcemap_file, build_id);
      file->set_debug_file(debug_file.get());
      out_build_ids->push_back(build_id);
    }
  }

  int64_t filesize_before =
      rollup->file_total() + rollup->filtered_file_total();
  file->ProcessFile(sink_ptrs);

  // kInputFile source: Copy the base map to the filename sink(s).
  for (auto sink : filename_sink_ptrs) {
    maps.base_map()->vm_map.ForEachRange(
        [sink](uint64_t start, uint64_t length) {
          sink->AddVMRange("inputfile_vmcopier", start, length,
                           sink->input_file().filename());
        });
    maps.base_map()->file_map.ForEachRange(
        [sink](uint64_t start, uint64_t length) {
          sink->AddFileRange("inputfile_filecopier",
                             sink->input_file().filename(), start, length);
        });
  }

  maps.ComputeRollup(rollup);

  // The ObjectFile implementation must guarantee this.
  int64_t filesize =
      rollup->file_total() + rollup->filtered_file_total() - filesize_before;
  (void)filesize;
  assert(filesize == file->file_data().data().size());

  if (verbose_level > 0 || options_.dump_raw_map()) {
    printf("Maps for %s:\n\n", filename.c_str());
    if (show != ShowDomain::kShowVM) {
      printf("FILE MAP:\n");
      maps.PrintFileMaps();
    }
    if (show != ShowDomain::kShowFile) {
      printf("VM MAP:\n");
      maps.PrintVMMaps();
    }
  }
}